

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int copy_from_lzss_window_to_unp(archive_read *a,void **buffer,int64_t startpos,size_t length)

{
  int error_number;
  void *pvVar1;
  void *pvVar2;
  char *fmt;
  size_t sVar3;
  long lVar4;
  void *__src;
  uint uVar5;
  ulong uVar6;
  
  pvVar2 = a->format->data;
  if (length <= *(uint *)((long)pvVar2 + 0xd8)) {
    pvVar1 = *(void **)((long)pvVar2 + 0xe0);
    if (pvVar1 == (void *)0x0) {
      pvVar1 = malloc((ulong)*(uint *)((long)pvVar2 + 0xd8));
      *(void **)((long)pvVar2 + 0xe0) = pvVar1;
      if (pvVar1 == (void *)0x0) {
        fmt = "Unable to allocate memory for uncompressed data.";
        error_number = 0xc;
        goto LAB_0023e0c3;
      }
    }
    uVar5 = (uint)startpos & *(uint *)((long)pvVar2 + 0x358);
    lVar4 = (long)(int)uVar5;
    uVar6 = (long)(int)*(uint *)((long)pvVar2 + 0x358) + 1;
    sVar3 = length;
    if (lVar4 + length <= uVar6) {
      pvVar1 = (void *)((long)pvVar1 + (ulong)*(uint *)((long)pvVar2 + 0xd4));
      __src = (void *)(lVar4 + *(long *)((long)pvVar2 + 0x350));
LAB_0023e179:
      memcpy(pvVar1,__src,sVar3);
      uVar5 = (int)length + *(int *)((long)pvVar2 + 0xd4);
      *(uint *)((long)pvVar2 + 0xd4) = uVar5;
      if (uVar5 < *(uint *)((long)pvVar2 + 0xd8)) {
        pvVar2 = (void *)0x0;
      }
      else {
        pvVar2 = *(void **)((long)pvVar2 + 0xe0);
      }
      *buffer = pvVar2;
      return 0;
    }
    if ((length <= uVar6) && (uVar5 = (int)uVar6 - uVar5, -1 < (int)uVar5)) {
      uVar6 = (ulong)uVar5;
      pvVar1 = (void *)((long)pvVar1 + (ulong)*(uint *)((long)pvVar2 + 0xd4));
      __src = (void *)(lVar4 + *(long *)((long)pvVar2 + 0x350));
      if (uVar6 <= length && length - uVar6 != 0) {
        memcpy(pvVar1,__src,uVar6);
        pvVar1 = (void *)((ulong)(uVar5 + *(int *)((long)pvVar2 + 0xd4)) +
                         *(long *)((long)pvVar2 + 0xe0));
        __src = *(void **)((long)pvVar2 + 0x350);
        sVar3 = length - uVar6;
      }
      goto LAB_0023e179;
    }
  }
  fmt = "Bad RAR file data";
  error_number = 0x54;
LAB_0023e0c3:
  archive_set_error(&a->archive,error_number,fmt);
  return -0x1e;
}

Assistant:

static int
copy_from_lzss_window_to_unp(struct archive_read *a, const void **buffer,
                             int64_t startpos, size_t length)
{
  int windowoffs, firstpart;
  struct rar *rar = (struct rar *)(a->format->data);

  if (length > rar->unp_buffer_size)
  {
    goto fatal;
  }

  if (!rar->unp_buffer)
  {
    if ((rar->unp_buffer = malloc(rar->unp_buffer_size)) == NULL)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Unable to allocate memory for uncompressed data.");
      return (ARCHIVE_FATAL);
    }
  }

  windowoffs = lzss_offset_for_position(&rar->lzss, startpos);
  if(windowoffs + length <= (size_t)lzss_size(&rar->lzss)) {
    memcpy(&rar->unp_buffer[rar->unp_offset], &rar->lzss.window[windowoffs],
           length);
  } else if (length <= (size_t)lzss_size(&rar->lzss)) {
    firstpart = lzss_size(&rar->lzss) - windowoffs;
    if (firstpart < 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "Bad RAR file data");
      return (ARCHIVE_FATAL);
    }
    if ((size_t)firstpart < length) {
      memcpy(&rar->unp_buffer[rar->unp_offset],
             &rar->lzss.window[windowoffs], firstpart);
      memcpy(&rar->unp_buffer[rar->unp_offset + firstpart],
             &rar->lzss.window[0], length - firstpart);
    } else {
      memcpy(&rar->unp_buffer[rar->unp_offset],
             &rar->lzss.window[windowoffs], length);
    }
  } else {
      goto fatal;
  }
  rar->unp_offset += (unsigned int) length;
  if (rar->unp_offset >= rar->unp_buffer_size)
    *buffer = rar->unp_buffer;
  else
    *buffer = NULL;
  return (ARCHIVE_OK);

fatal:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Bad RAR file data");
  return (ARCHIVE_FATAL);
}